

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containersNative.cpp
# Opt level: O0

void chatra::emb::containers::byteArray_remove(Ct *ct)

{
  reference pvVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_48;
  uchar *local_40;
  size_t local_28;
  size_t position;
  lock_guard<chatra::emb::SpinLock> lock;
  ByteArrayData *self;
  Ct *ct_local;
  
  lock._M_device = (mutex_type *)NativeCallContext::self<chatra::emb::containers::ByteArrayData>(ct)
  ;
  std::lock_guard<chatra::emb::SpinLock>::lock_guard
            ((lock_guard<chatra::emb::SpinLock> *)&position,
             &(((ByteArrayData *)lock._M_device)->super_ByteArray).lock);
  local_28 = ByteArrayData::fetchIndex((ByteArrayData *)lock._M_device,ct,0,false);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      (lock._M_device + 0x18),local_28);
  NativeCallContext::set<unsigned_char,_nullptr>(ct,*pvVar1);
  this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(lock._M_device + 0x18);
  local_48._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin(this);
  local_40 = (uchar *)__gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_48,local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase(this,(const_iterator)local_40);
  std::lock_guard<chatra::emb::SpinLock>::~lock_guard
            ((lock_guard<chatra::emb::SpinLock> *)&position);
  return;
}

Assistant:

static void byteArray_remove(Ct& ct) {
	auto* self = ct.self<ByteArrayData>();
	std::lock_guard<SpinLock> lock(self->lock);
	auto position = self->fetchIndex(ct, 0, false);
	ct.set(self->data[position]);
	self->data.erase(self->data.cbegin() + position);
}